

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

string * full_ident_name_abi_cxx11_(vector<Token,_std::allocator<Token>_> *tokens,int begin_index)

{
  char *pcVar1;
  const_reference pvVar2;
  int in_EDX;
  vector<Token,_std::allocator<Token>_> *in_RSI;
  string *in_RDI;
  int i;
  string *res;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_81 [33];
  string local_60 [32];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  int local_28;
  allocator local_16;
  undefined1 local_15;
  int local_14;
  vector<Token,_std::allocator<Token>_> *local_10;
  
  local_15 = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[](in_RSI,(long)in_EDX);
  pcVar1 = (pvVar2->u).s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_16);
  std::allocator<char>::~allocator((allocator<char> *)&local_16);
  while( true ) {
    while( true ) {
      local_28 = local_14 + -1;
      if (local_28 < 0) {
        return in_RDI;
      }
      pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[](local_10,(long)local_28);
      if ((pvVar2->type != TK_DOT) &&
         (pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[](local_10,(long)local_28),
         pvVar2->type != TK_NULLGETSTR)) break;
      local_38 = std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_40 = std::__cxx11::string::insert(in_RDI,local_30,0x2e);
      local_14 = local_28;
    }
    pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[](local_10,(long)local_28);
    if (pvVar2->type != TK_IDENTIFIER) break;
    pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[](local_10,(long)local_28);
    in_stack_ffffffffffffff40 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pvVar2->u).s;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_81 + 1),(char *)in_stack_ffffffffffffff40,(allocator *)__lhs);
    std::operator+(__lhs,in_stack_ffffffffffffff40);
    std::__cxx11::string::operator=((string *)in_RDI,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string((string *)(local_81 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_81);
    local_14 = local_28;
  }
  return in_RDI;
}

Assistant:

string full_ident_name(const std::vector<Token> & tokens, int begin_index)
{
  string res = tokens[begin_index].u.s;
  for (int i = begin_index - 1; i >= 0; i--)
  {
    if (tokens[i].type == TK_DOT || tokens[i].type == TK_NULLGETSTR)
      res.insert(res.begin(), '.');
    else if (tokens[i].type == TK_IDENTIFIER)
      res = string(tokens[i].u.s) + res;
    else
      break;
  }
  return res;
}